

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O0

void __thiscall
BuildsMetaMakefileGenerator::accumulateVariableFromBuilds
          (BuildsMetaMakefileGenerator *this,ProKey *name,Build *dst)

{
  bool bVar1;
  ProStringList *this_00;
  const_iterator o;
  Build **ppBVar2;
  QMakeProject *in_RDX;
  ProKey *in_RDI;
  long in_FS_OFFSET;
  Build *build;
  QList<BuildsMetaMakefileGenerator::Build_*> *__range1;
  ProStringList *values;
  const_iterator __end1;
  const_iterator __begin1;
  QMakeProject *in_stack_ffffffffffffffb0;
  QMakeProject *this_01;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::projectFile
            ((MakefileGenerator *)
             (in_RDX->super_QMakeEvaluator).m_locationStack.super_QList<QMakeEvaluator::Location>.d.
             size);
  this_00 = QMakeProject::values(in_stack_ffffffffffffffb0,in_RDI);
  local_10.i = (Build **)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<BuildsMetaMakefileGenerator::Build_*>::begin
                       ((QList<BuildsMetaMakefileGenerator::Build_*> *)in_stack_ffffffffffffffb0);
  o = QList<BuildsMetaMakefileGenerator::Build_*>::end
                ((QList<BuildsMetaMakefileGenerator::Build_*> *)in_stack_ffffffffffffffb0);
  while( true ) {
    bVar1 = QList<BuildsMetaMakefileGenerator::Build_*>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    ppBVar2 = QList<BuildsMetaMakefileGenerator::Build_*>::const_iterator::operator*(&local_10);
    this_01 = (QMakeProject *)*ppBVar2;
    if (this_01 != in_RDX) {
      MakefileGenerator::projectFile
                ((MakefileGenerator *)
                 (this_01->super_QMakeEvaluator).m_locationStack.
                 super_QList<QMakeEvaluator::Location>.d.size);
      QMakeProject::values(this_01,in_RDI);
      QList<ProString>::operator+=((QList<ProString> *)this_01,(QList<ProString> *)in_RDI);
    }
    QList<BuildsMetaMakefileGenerator::Build_*>::const_iterator::operator++(&local_10);
  }
  ProStringList::removeDuplicates(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BuildsMetaMakefileGenerator::accumulateVariableFromBuilds(const ProKey &name, Build *dst) const
{
    ProStringList &values = dst->makefile->projectFile()->values(name);
    for (auto build : makefiles) {
        if (build != dst)
            values += build->makefile->projectFile()->values(name);
    }
    values.removeDuplicates();
}